

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

void __thiscall MemoryProfiler::PrintArenaHeader(MemoryProfiler *this,char16 *title)

{
  char16 *title_local;
  MemoryProfiler *this_local;
  
  Output::Print(
               L"--------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"%-20s:%7s %9s %9s %9s %6s %9s %6s %9s %5s | %5s\n",title,L"#Alloc",L"AllocByte",
                L"ReqBytes",L"AlignByte",L"#Reuse",L"ReuseByte",L"#Free",L"FreeBytes",L"Reset",
                L"Count");
  Output::Print(
               L"--------------------------------------------------------------------------------------------------------\n"
               );
  return;
}

Assistant:

void
MemoryProfiler::PrintArenaHeader(char16 const * title)
{
    Output::Print(_u("--------------------------------------------------------------------------------------------------------\n"));

    Output::Print(_u("%-20s:%7s %9s %9s %9s %6s %9s %6s %9s %5s | %5s\n"),
            title,
            _u("#Alloc"),
            _u("AllocByte"),
            _u("ReqBytes"),
            _u("AlignByte"),
            _u("#Reuse"),
            _u("ReuseByte"),
            _u("#Free"),
            _u("FreeBytes"),
            _u("Reset"),
            _u("Count"));

    Output::Print(_u("--------------------------------------------------------------------------------------------------------\n"));
}